

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseProblem.h
# Opt level: O2

void covenant::parse_problem<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
               (CFGProblem *p,StrParse *input,shared_ptr<covenant::TerminalFactory> *tfac)

{
  char cVar1;
  string *this;
  allocator local_61;
  shared_ptr<covenant::TerminalFactory> local_60;
  string local_50 [32];
  
  consume_blanks<covenant::StrParse>(input);
  while( true ) {
    while( true ) {
      if ((input->str)._M_string_length <= (ulong)input->idx) {
        return;
      }
      cVar1 = (input->str)._M_dataplus._M_p[input->idx];
      if (cVar1 != '(') break;
      consume_blanks<covenant::StrParse>(input);
      local_60.px = tfac->px;
      local_60.pn.pi_ = (tfac->pn).pi_;
      if (local_60.pn.pi_ != (sp_counted_base *)0x0) {
        LOCK();
        (local_60.pn.pi_)->use_count_ = (local_60.pn.pi_)->use_count_ + 1;
        UNLOCK();
      }
      parse_constraint<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
                (p,input,&local_60);
      boost::detail::shared_count::~shared_count(&local_60.pn);
      consume_blanks<covenant::StrParse>(input);
    }
    if (cVar1 != ';') break;
    consume_comment<covenant::StrParse>(input);
  }
  if (cVar1 == ')') {
    return;
  }
  this = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string(local_50,"make sure CFG is enclosed between parenthesis",&local_61);
  std::__cxx11::string::string(this,local_50);
  __cxa_throw(this,&error::typeinfo,error::~error);
}

Assistant:

void parse_problem(CFGProblem& p, In& input, TerminalFactory tfac)
{

  consume_blanks(input);
  while(!input.empty())
  {
    char c = input.peek();
    // gross fix if the last constraint does not finish with some blank
    if (input.peek() == ')') break;

    if(c == ';')
    {
      // Comment line.
      consume_comment(input);
    } 
    else 
    {
      if (input.peek() != '(')
        throw error("make sure CFG is enclosed between parenthesis");

      consume_blanks(input);
      parse_constraint(p, input, tfac);
      consume_blanks(input);
    }
  }
}